

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void run_proper_context_tests(int use_prealloc)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  int iVar2;
  secp256k1_context *b;
  size_t sVar3;
  secp256k1_context *psVar4;
  size_t sVar5;
  secp256k1_context *psVar6;
  void *prealloc;
  undefined8 uVar7;
  char *pcVar8;
  void *local_1e0;
  int32_t dummy;
  secp256k1_context *local_1d0;
  uchar seed [32];
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar msg;
  secp256k1_scalar nonce;
  secp256k1_scalar key;
  secp256k1_ge pub;
  secp256k1_gej pubj;
  
  dummy = 0;
  seed[0x10] = '\0';
  seed[0x11] = '\0';
  seed[0x12] = '\0';
  seed[0x13] = '\0';
  seed[0x14] = '\0';
  seed[0x15] = '\0';
  seed[0x16] = '\0';
  seed[0x17] = '\0';
  seed[0x18] = '\0';
  seed[0x19] = '\0';
  seed[0x1a] = '\0';
  seed[0x1b] = '\0';
  seed[0x1c] = '\0';
  seed[0x1d] = '\0';
  seed[0x1e] = '\0';
  seed[0x1f] = '\0';
  seed[0] = '\x17';
  seed[1] = '\0';
  seed[2] = '\0';
  seed[3] = '\0';
  seed[4] = '\0';
  seed[5] = '\0';
  seed[6] = '\0';
  seed[7] = '\0';
  seed[8] = '\0';
  seed[9] = '\0';
  seed[10] = '\0';
  seed[0xb] = '\0';
  seed[0xc] = '\0';
  seed[0xd] = '\0';
  seed[0xe] = '\0';
  seed[0xf] = '\0';
  b = secp256k1_context_create(1);
  if (use_prealloc == 0) {
    psVar4 = secp256k1_context_create(1);
    local_1e0 = (void *)0x0;
  }
  else {
    sVar3 = secp256k1_context_preallocated_size(1);
    local_1e0 = malloc(sVar3);
    if (local_1e0 == (void *)0x0) {
      pcVar8 = "test condition failed: my_ctx_prealloc != NULL";
      uVar7 = 0xff;
      goto LAB_0011c0d9;
    }
    psVar4 = secp256k1_context_preallocated_create(local_1e0,1);
  }
  iVar2 = context_eq(psVar4,b);
  if (iVar2 == 0) {
    pcVar8 = "test condition failed: context_eq(my_ctx, my_ctx_fresh)";
    uVar7 = 0x106;
  }
  else {
    iVar2 = secp256k1_context_randomize(psVar4,seed);
    if (iVar2 == 0) {
      pcVar8 = "test condition failed: secp256k1_context_randomize(my_ctx, seed) == 1";
      uVar7 = 0x107;
    }
    else {
      iVar2 = context_eq(psVar4,b);
      if (iVar2 == 0) {
        iVar2 = secp256k1_context_randomize(psVar4,(uchar *)0x0);
        if (iVar2 == 0) {
          pcVar8 = "test condition failed: secp256k1_context_randomize(my_ctx, NULL) == 1";
          uVar7 = 0x109;
        }
        else {
          iVar2 = context_eq(psVar4,b);
          if (iVar2 == 0) {
            pcVar8 = "test condition failed: context_eq(my_ctx, my_ctx_fresh)";
            uVar7 = 0x10a;
          }
          else {
            secp256k1_context_set_error_callback
                      (psVar4,secp256k1_default_illegal_callback_fn,(void *)0x0);
            p_Var1 = (psVar4->error_callback).fn;
            if (p_Var1 == secp256k1_default_error_callback_fn) {
              pcVar8 = 
              "test condition failed: my_ctx->error_callback.fn != secp256k1_default_error_callback_fn"
              ;
              uVar7 = 0x10e;
            }
            else if (p_Var1 == secp256k1_default_illegal_callback_fn) {
              sVar3 = secp256k1_context_preallocated_clone_size(psVar4);
              sVar5 = secp256k1_context_preallocated_size(1);
              if (sVar3 == sVar5) {
                if (use_prealloc == 0) {
                  sVar3 = secp256k1_context_preallocated_size(1);
                  prealloc = malloc(sVar3);
                  if (prealloc == (void *)0x0) {
                    pcVar8 = "test condition failed: prealloc_tmp != NULL";
                    uVar7 = 299;
                    goto LAB_0011c0d9;
                  }
                  psVar6 = secp256k1_context_preallocated_clone(psVar4,prealloc);
                  iVar2 = context_eq(psVar4,psVar6);
                  if (iVar2 == 0) {
                    pcVar8 = "test condition failed: context_eq(ctx_tmp, my_ctx)";
                    uVar7 = 0x12e;
                    goto LAB_0011c0d9;
                  }
                  secp256k1_context_destroy(psVar4);
                  psVar4 = secp256k1_context_clone(psVar6);
                  iVar2 = context_eq(psVar6,psVar4);
                  if (iVar2 == 0) {
                    pcVar8 = "test condition failed: context_eq(ctx_tmp, my_ctx)";
                    uVar7 = 0x133;
                    goto LAB_0011c0d9;
                  }
                  secp256k1_context_preallocated_destroy(psVar6);
                  free(prealloc);
                }
                else {
                  psVar6 = secp256k1_context_clone(psVar4);
                  iVar2 = context_eq(psVar4,psVar6);
                  if (iVar2 == 0) {
                    pcVar8 = "test condition failed: context_eq(ctx_tmp, my_ctx)";
                    uVar7 = 0x11c;
                    goto LAB_0011c0d9;
                  }
                  secp256k1_context_preallocated_destroy(psVar4);
                  free(local_1e0);
                  sVar3 = secp256k1_context_preallocated_size(1);
                  local_1e0 = malloc(sVar3);
                  if (local_1e0 == (void *)0x0) {
                    pcVar8 = "test condition failed: my_ctx_prealloc != NULL";
                    uVar7 = 0x121;
                    goto LAB_0011c0d9;
                  }
                  psVar4 = secp256k1_context_preallocated_clone(psVar6,local_1e0);
                  iVar2 = context_eq(psVar6,psVar4);
                  if (iVar2 == 0) {
                    pcVar8 = "test condition failed: context_eq(ctx_tmp, my_ctx)";
                    uVar7 = 0x124;
                    goto LAB_0011c0d9;
                  }
                  secp256k1_context_destroy(psVar6);
                }
                p_Var1 = (psVar4->error_callback).fn;
                if (p_Var1 == secp256k1_default_error_callback_fn) {
                  pcVar8 = 
                  "test condition failed: my_ctx->error_callback.fn != secp256k1_default_error_callback_fn"
                  ;
                  uVar7 = 0x13a;
                }
                else if (p_Var1 == secp256k1_default_illegal_callback_fn) {
                  secp256k1_context_set_error_callback
                            (psVar4,(_func_void_char_ptr_void_ptr *)0x0,(void *)0x0);
                  if ((psVar4->error_callback).fn == secp256k1_default_error_callback_fn) {
                    iVar2 = context_eq(psVar4,b);
                    if (iVar2 == 0) {
                      pcVar8 = "test condition failed: context_eq(my_ctx, my_ctx_fresh)";
                      uVar7 = 0x13f;
                    }
                    else {
                      secp256k1_context_set_illegal_callback(psVar4,counting_callback_fn,&dummy);
                      if ((psVar4->illegal_callback).fn == counting_callback_fn) {
                        if ((int32_t *)(psVar4->illegal_callback).data == &dummy) {
                          secp256k1_context_set_illegal_callback
                                    (psVar4,(_func_void_char_ptr_void_ptr *)0x0,(void *)0x0);
                          if ((psVar4->illegal_callback).fn == secp256k1_default_illegal_callback_fn
                             ) {
                            if ((psVar4->illegal_callback).data == (void *)0x0) {
                              iVar2 = context_eq(psVar4,b);
                              if (iVar2 == 0) {
                                pcVar8 = "test condition failed: context_eq(my_ctx, my_ctx_fresh)";
                                uVar7 = 0x148;
                              }
                              else {
                                local_1d0 = b;
                                testutil_random_scalar_order_test(&msg);
                                testutil_random_scalar_order_test(&key);
                                secp256k1_ecmult_gen(&psVar4->ecmult_gen_ctx,&pubj,&key);
                                secp256k1_ge_set_gej(&pub,&pubj);
                                do {
                                  testutil_random_scalar_order_test(&nonce);
                                  iVar2 = secp256k1_ecdsa_sig_sign
                                                    (&psVar4->ecmult_gen_ctx,&sigr,&sigs,&key,&msg,
                                                     &nonce,(int *)0x0);
                                } while (iVar2 == 0);
                                iVar2 = secp256k1_ecdsa_sig_sign
                                                  (&psVar4->ecmult_gen_ctx,&sigr,&sigs,&key,&msg,
                                                   &nonce,(int *)0x0);
                                if (iVar2 == 0) {
                                  pcVar8 = 
                                  "test condition failed: secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL)"
                                  ;
                                  uVar7 = 0x156;
                                }
                                else {
                                  iVar2 = secp256k1_ecdsa_sig_verify(&sigr,&sigs,&pub,&msg);
                                  if (iVar2 != 0) {
                                    if (use_prealloc == 0) {
                                      secp256k1_context_destroy(psVar4);
                                    }
                                    else {
                                      secp256k1_context_preallocated_destroy(psVar4);
                                      free(local_1e0);
                                    }
                                    secp256k1_context_destroy(local_1d0);
                                    return;
                                  }
                                  pcVar8 = 
                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg)"
                                  ;
                                  uVar7 = 0x159;
                                }
                              }
                            }
                            else {
                              pcVar8 = 
                              "test condition failed: my_ctx->illegal_callback.data == NULL";
                              uVar7 = 0x147;
                            }
                          }
                          else {
                            pcVar8 = 
                            "test condition failed: my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn"
                            ;
                            uVar7 = 0x146;
                          }
                        }
                        else {
                          pcVar8 = "test condition failed: my_ctx->illegal_callback.data == &dummy";
                          uVar7 = 0x144;
                        }
                      }
                      else {
                        pcVar8 = 
                        "test condition failed: my_ctx->illegal_callback.fn == counting_callback_fn"
                        ;
                        uVar7 = 0x143;
                      }
                    }
                  }
                  else {
                    pcVar8 = 
                    "test condition failed: my_ctx->error_callback.fn == secp256k1_default_error_callback_fn"
                    ;
                    uVar7 = 0x13e;
                  }
                }
                else {
                  pcVar8 = 
                  "test condition failed: my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn"
                  ;
                  uVar7 = 0x13b;
                }
              }
              else {
                pcVar8 = 
                "test condition failed: secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE)"
                ;
                uVar7 = 0x112;
              }
            }
            else {
              pcVar8 = 
              "test condition failed: my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn"
              ;
              uVar7 = 0x10f;
            }
          }
        }
      }
      else {
        pcVar8 = "test condition failed: !context_eq(my_ctx, my_ctx_fresh)";
        uVar7 = 0x108;
      }
    }
  }
LAB_0011c0d9:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar7,pcVar8);
  abort();
}

Assistant:

static void run_proper_context_tests(int use_prealloc) {
    int32_t dummy = 0;
    secp256k1_context *my_ctx, *my_ctx_fresh;
    void *my_ctx_prealloc = NULL;
    unsigned char seed[32] = {0x17};

    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar msg, key, nonce;
    secp256k1_scalar sigr, sigs;

    /* Fresh reference context for comparison */
    my_ctx_fresh = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (use_prealloc) {
        my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
        CHECK(my_ctx_prealloc != NULL);
        my_ctx = secp256k1_context_preallocated_create(my_ctx_prealloc, SECP256K1_CONTEXT_NONE);
    } else {
        my_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    }

    /* Randomize and reset randomization */
    CHECK(context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, seed) == 1);
    CHECK(!context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, NULL) == 1);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* set error callback (to a function that still aborts in case malloc() fails in secp256k1_context_clone() below) */
    secp256k1_context_set_error_callback(my_ctx, secp256k1_default_illegal_callback_fn, NULL);
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);

    /* check if sizes for cloning are consistent */
    CHECK(secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));

    /*** clone and destroy all of them to make sure cloning was complete ***/
    {
        secp256k1_context *ctx_tmp;

        if (use_prealloc) {
            /* clone into a non-preallocated context and then again into a new preallocated one. */
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);

            free(my_ctx_prealloc);
            my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(my_ctx_prealloc != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, my_ctx_prealloc);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);
        } else {
            /* clone into a preallocated context and then again into a new non-preallocated one. */
            void *prealloc_tmp;

            prealloc_tmp = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(prealloc_tmp != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, prealloc_tmp);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);

            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);
            free(prealloc_tmp);
        }
    }

    /* Verify that the error callback makes it across the clone. */
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);
    /* And that it resets back to default. */
    secp256k1_context_set_error_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_error_callback_fn);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* Verify that setting and resetting illegal callback works */
    secp256k1_context_set_illegal_callback(my_ctx, counting_callback_fn, &dummy);
    CHECK(my_ctx->illegal_callback.fn == counting_callback_fn);
    CHECK(my_ctx->illegal_callback.data == &dummy);
    secp256k1_context_set_illegal_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == NULL);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /*** attempt to use them ***/
    testutil_random_scalar_order_test(&msg);
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&my_ctx->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);

    /* obtain a working nonce */
    do {
        testutil_random_scalar_order_test(&nonce);
    } while(!secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try signing */
    CHECK(secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try verifying */
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));

    /* cleanup */
    if (use_prealloc) {
        secp256k1_context_preallocated_destroy(my_ctx);
        free(my_ctx_prealloc);
    } else {
        secp256k1_context_destroy(my_ctx);
    }
    secp256k1_context_destroy(my_ctx_fresh);

    /* Defined as no-op. */
    secp256k1_context_destroy(NULL);
    secp256k1_context_preallocated_destroy(NULL);
}